

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall btMultiBodyDynamicsWorld::debugDrawWorld(btMultiBodyDynamicsWorld *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  btMultiBodyConstraint **ppbVar6;
  btMultiBody **ppbVar7;
  btMultibodyLink *pbVar8;
  long *in_RDI;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 uVar9;
  undefined4 uVar10;
  btQuaternion bVar11;
  btVector3 bVar12;
  btVector3 to_2;
  btVector3 from_2;
  btVector4 color_2;
  btVector3 vec_2;
  btVector3 to_1;
  btVector3 from_1;
  btVector4 color_1;
  btVector3 vec_1;
  btVector3 to;
  btVector3 from;
  btVector4 color;
  btVector3 vec;
  btTransform *tr;
  int m;
  btMultiBody *bod;
  int b;
  btMultiBodyConstraint *constraint;
  int c;
  btAlignedObjectArray<btVector3> local_origin1;
  btAlignedObjectArray<btQuaternion> world_to_local1;
  CProfileSample __profile_1;
  int mode;
  bool drawConstraints;
  CProfileSample __profile;
  undefined4 in_stack_fffffffffffff828;
  int in_stack_fffffffffffff82c;
  btMultiBody *in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff838 [16];
  undefined1 in_stack_fffffffffffff848 [16];
  undefined1 in_stack_fffffffffffff858 [16];
  btScalar local_738;
  btScalar bStack_734;
  btDiscreteDynamicsWorld *this_00;
  btScalar local_718;
  btScalar bStack_714;
  btScalar local_6e8;
  btScalar bStack_6e4;
  btScalar local_6c8;
  btScalar bStack_6c4;
  btScalar local_698;
  btScalar bStack_694;
  btScalar local_668;
  btScalar bStack_664;
  btScalar local_648;
  btScalar bStack_644;
  btScalar local_638;
  btScalar bStack_634;
  undefined1 in_stack_fffffffffffff9d8 [16];
  undefined1 in_stack_fffffffffffff9e8 [16];
  btScalar local_5e8;
  btScalar bStack_5e4;
  btScalar local_5b8;
  btScalar bStack_5b4;
  btScalar local_598;
  btScalar bStack_594;
  btScalar local_568;
  btScalar bStack_564;
  btScalar local_548;
  btScalar bStack_544;
  btScalar local_518;
  btScalar bStack_514;
  btScalar local_4e8;
  btScalar bStack_4e4;
  btScalar local_4c8;
  btScalar bStack_4c4;
  btScalar local_4b8;
  btScalar bStack_4b4;
  btScalar local_498;
  btScalar bStack_494;
  btScalar local_468;
  btScalar bStack_464;
  btScalar local_438;
  btScalar bStack_434;
  btScalar local_418;
  btScalar bStack_414;
  btScalar local_3e8;
  btScalar bStack_3e4;
  btScalar local_3c8;
  btScalar bStack_3c4;
  btScalar local_398;
  btScalar bStack_394;
  btScalar local_368;
  btScalar bStack_364;
  btScalar local_2c8;
  btScalar bStack_2c4;
  btScalar local_2c0;
  btScalar bStack_2bc;
  btScalar local_2b8;
  btScalar bStack_2b4;
  undefined8 local_2b0;
  btScalar local_2a8;
  btScalar bStack_2a4;
  undefined8 local_2a0;
  btScalar local_298;
  btScalar bStack_294;
  undefined8 local_290;
  btScalar local_288;
  btScalar bStack_284;
  undefined8 local_280;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 local_26c;
  undefined1 local_268 [16];
  btScalar local_258;
  btScalar bStack_254;
  undefined8 local_250;
  btScalar local_248;
  btScalar bStack_244;
  undefined8 local_240;
  btScalar local_238;
  btScalar bStack_234;
  undefined8 local_230;
  btScalar local_228;
  btScalar bStack_224;
  undefined8 local_220;
  btScalar local_218;
  btScalar bStack_214;
  btScalar local_210;
  btScalar bStack_20c;
  btScalar local_208;
  btScalar bStack_204;
  undefined8 local_200;
  btScalar local_1f8;
  btScalar bStack_1f4;
  undefined8 local_1f0;
  btScalar local_1e8;
  btScalar bStack_1e4;
  undefined8 local_1e0;
  btScalar local_1d8;
  btScalar bStack_1d4;
  undefined8 local_1d0;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined4 local_1c0;
  undefined4 local_1bc;
  undefined1 local_1b8 [16];
  btScalar local_1a8;
  btScalar bStack_1a4;
  undefined8 local_1a0;
  btScalar local_198;
  btScalar bStack_194;
  undefined8 local_190;
  btScalar local_188;
  btScalar bStack_184;
  undefined8 local_180;
  btScalar local_178;
  btScalar bStack_174;
  undefined8 local_170;
  btScalar local_168;
  btScalar bStack_164;
  btScalar local_160;
  btScalar bStack_15c;
  btScalar local_158;
  btScalar bStack_154;
  undefined8 local_150;
  btScalar local_148;
  btScalar bStack_144;
  undefined8 local_140;
  btScalar local_138;
  btScalar bStack_134;
  undefined8 local_130;
  btScalar local_128;
  btScalar bStack_124;
  undefined8 local_120;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined1 local_108 [16];
  btScalar local_f8;
  btScalar bStack_f4;
  undefined8 local_f0;
  btScalar local_e8;
  btScalar bStack_e4;
  undefined8 local_e0;
  btTransform *local_d8;
  int local_cc;
  undefined1 local_c8 [64];
  btMultiBody *local_88;
  int local_7c;
  btMultiBodyConstraint *local_78;
  int local_6c;
  uint local_20;
  byte local_a;
  
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_fffffffffffff830,
             (char *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
  local_a = 0;
  lVar4 = (**(code **)(*in_RDI + 0x28))();
  if (lVar4 != 0) {
    plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
    local_20 = (**(code **)(*plVar5 + 0x70))();
    if ((local_20 & 0x1800) != 0) {
      local_a = 1;
    }
    if ((local_a & 1) != 0) {
      CProfileSample::CProfileSample
                ((CProfileSample *)in_stack_fffffffffffff830,
                 (char *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828));
      btAlignedObjectArray<btQuaternion>::btAlignedObjectArray
                ((btAlignedObjectArray<btQuaternion> *)in_stack_fffffffffffff830);
      btAlignedObjectArray<btVector3>::btAlignedObjectArray
                ((btAlignedObjectArray<btVector3> *)in_stack_fffffffffffff830);
      for (local_6c = 0; iVar2 = local_6c,
          iVar3 = btAlignedObjectArray<btMultiBodyConstraint_*>::size
                            ((btAlignedObjectArray<btMultiBodyConstraint_*> *)(in_RDI + 0x3d)),
          iVar2 < iVar3; local_6c = local_6c + 1) {
        ppbVar6 = btAlignedObjectArray<btMultiBodyConstraint_*>::operator[]
                            ((btAlignedObjectArray<btMultiBodyConstraint_*> *)(in_RDI + 0x3d),
                             local_6c);
        local_78 = *ppbVar6;
        (**(code **)(*in_RDI + 0x1b8))(in_RDI,local_78);
      }
      local_7c = 0;
      while( true ) {
        iVar2 = local_7c;
        iVar3 = btAlignedObjectArray<btMultiBody_*>::size
                          ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x39));
        if (iVar3 <= iVar2) break;
        ppbVar7 = btAlignedObjectArray<btMultiBody_*>::operator[]
                            ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x39),local_7c);
        local_88 = *ppbVar7;
        btMultiBody::forwardKinematics
                  (in_stack_fffffffffffff9e8._8_8_,in_stack_fffffffffffff9e8._0_8_,
                   in_stack_fffffffffffff9d8._8_8_);
        plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
        btMultiBody::getBaseWorldTransform(in_stack_fffffffffffff848._0_8_);
        (**(code **)(*plVar5 + 0x80))(0x3dcccccd,plVar5,local_c8);
        for (local_cc = 0; iVar2 = local_cc,
            iVar3 = btMultiBody::getNumLinks((btMultiBody *)0x250384), iVar2 < iVar3;
            local_cc = local_cc + 1) {
          pbVar8 = btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
          local_d8 = &pbVar8->m_cachedWorldTransform;
          plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
          (**(code **)(*plVar5 + 0x80))(0x3dcccccd,plVar5,local_d8);
          pbVar8 = btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
          if (pbVar8->m_jointType == eRevolute) {
            bVar11 = btTransform::getRotation((btTransform *)in_stack_fffffffffffff830);
            local_f0 = bVar11.super_btQuadWord.m_floats._8_8_;
            local_368 = bVar11.super_btQuadWord.m_floats[0];
            bStack_364 = bVar11.super_btQuadWord.m_floats[1];
            local_f8 = local_368;
            bStack_f4 = bStack_364;
            btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
            bVar12 = quatRotate(in_stack_fffffffffffff858._8_8_,in_stack_fffffffffffff858._0_8_);
            local_e0 = bVar12.m_floats._8_8_;
            local_398 = bVar12.m_floats[0];
            bStack_394 = bVar12.m_floats[1];
            local_e8 = local_398;
            bStack_e4 = bStack_394;
            local_10c = 0;
            local_110 = 0;
            local_114 = 0;
            local_118 = 0x3f800000;
            btVector4::btVector4
                      (in_stack_fffffffffffff848._8_8_,in_stack_fffffffffffff848._0_8_,
                       in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_,
                       (btScalar *)in_stack_fffffffffffff830);
            btTransform::getOrigin(local_d8);
            bVar12 = operator+(in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_);
            local_130 = bVar12.m_floats._8_8_;
            local_3c8 = bVar12.m_floats[0];
            bStack_3c4 = bVar12.m_floats[1];
            local_138 = local_3c8;
            bStack_134 = bStack_3c4;
            bVar11 = btTransform::getRotation((btTransform *)in_stack_fffffffffffff830);
            local_150 = bVar11.super_btQuadWord.m_floats._8_8_;
            local_3e8 = bVar11.super_btQuadWord.m_floats[0];
            bStack_3e4 = bVar11.super_btQuadWord.m_floats[1];
            local_158 = local_3e8;
            bStack_154 = bStack_3e4;
            btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
            bVar12 = quatRotate(in_stack_fffffffffffff858._8_8_,in_stack_fffffffffffff858._0_8_);
            local_140 = bVar12.m_floats._8_8_;
            local_418 = bVar12.m_floats[0];
            bStack_414 = bVar12.m_floats[1];
            local_148 = local_418;
            bStack_144 = bStack_414;
            bVar12 = operator-(in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_);
            local_120 = bVar12.m_floats._8_8_;
            local_438 = bVar12.m_floats[0];
            bStack_434 = bVar12.m_floats[1];
            local_128 = local_438;
            bStack_124 = bStack_434;
            btTransform::getOrigin(local_d8);
            bVar11 = btTransform::getRotation((btTransform *)in_stack_fffffffffffff830);
            local_180 = bVar11.super_btQuadWord.m_floats._8_8_;
            local_468 = bVar11.super_btQuadWord.m_floats[0];
            bStack_464 = bVar11.super_btQuadWord.m_floats[1];
            local_188 = local_468;
            bStack_184 = bStack_464;
            btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
            bVar12 = quatRotate(in_stack_fffffffffffff858._8_8_,in_stack_fffffffffffff858._0_8_);
            local_170 = bVar12.m_floats._8_8_;
            local_498 = bVar12.m_floats[0];
            bStack_494 = bVar12.m_floats[1];
            local_178 = local_498;
            bStack_174 = bStack_494;
            bVar12 = operator-(in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_);
            local_4c8 = bVar12.m_floats[2];
            bStack_4c4 = bVar12.m_floats[3];
            local_4b8 = bVar12.m_floats[0];
            bStack_4b4 = bVar12.m_floats[1];
            local_168 = local_4b8;
            bStack_164 = bStack_4b4;
            local_160 = local_4c8;
            bStack_15c = bStack_4c4;
            plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
            (**(code **)(*plVar5 + 0x20))(plVar5,&local_128,&local_168,local_108);
          }
          pbVar8 = btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
          if (pbVar8->m_jointType == eFixed) {
            bVar11 = btTransform::getRotation((btTransform *)in_stack_fffffffffffff830);
            local_1a0 = bVar11.super_btQuadWord.m_floats._8_8_;
            local_4e8 = bVar11.super_btQuadWord.m_floats[0];
            bStack_4e4 = bVar11.super_btQuadWord.m_floats[1];
            local_1a8 = local_4e8;
            bStack_1a4 = bStack_4e4;
            btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
            bVar12 = quatRotate(in_stack_fffffffffffff858._8_8_,in_stack_fffffffffffff858._0_8_);
            local_190 = bVar12.m_floats._8_8_;
            local_518 = bVar12.m_floats[0];
            bStack_514 = bVar12.m_floats[1];
            local_198 = local_518;
            bStack_194 = bStack_514;
            local_1bc = 0;
            local_1c0 = 0;
            local_1c4 = 0;
            local_1c8 = 0x3f800000;
            btVector4::btVector4
                      (in_stack_fffffffffffff848._8_8_,in_stack_fffffffffffff848._0_8_,
                       in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_,
                       (btScalar *)in_stack_fffffffffffff830);
            btTransform::getOrigin(local_d8);
            bVar12 = operator+(in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_);
            local_1e0 = bVar12.m_floats._8_8_;
            local_548 = bVar12.m_floats[0];
            bStack_544 = bVar12.m_floats[1];
            local_1e8 = local_548;
            bStack_1e4 = bStack_544;
            bVar11 = btTransform::getRotation((btTransform *)in_stack_fffffffffffff830);
            local_200 = bVar11.super_btQuadWord.m_floats._8_8_;
            local_568 = bVar11.super_btQuadWord.m_floats[0];
            bStack_564 = bVar11.super_btQuadWord.m_floats[1];
            local_208 = local_568;
            bStack_204 = bStack_564;
            btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
            bVar12 = quatRotate(in_stack_fffffffffffff858._8_8_,in_stack_fffffffffffff858._0_8_);
            local_1f0 = bVar12.m_floats._8_8_;
            local_598 = bVar12.m_floats[0];
            bStack_594 = bVar12.m_floats[1];
            local_1f8 = local_598;
            bStack_1f4 = bStack_594;
            bVar12 = operator-(in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_);
            local_1d0 = bVar12.m_floats._8_8_;
            local_5b8 = bVar12.m_floats[0];
            bStack_5b4 = bVar12.m_floats[1];
            local_1d8 = local_5b8;
            bStack_1d4 = bStack_5b4;
            btTransform::getOrigin(local_d8);
            bVar11 = btTransform::getRotation((btTransform *)in_stack_fffffffffffff830);
            local_230 = bVar11.super_btQuadWord.m_floats._8_8_;
            local_5e8 = bVar11.super_btQuadWord.m_floats[0];
            bStack_5e4 = bVar11.super_btQuadWord.m_floats[1];
            local_238 = local_5e8;
            bStack_234 = bStack_5e4;
            uVar9 = extraout_XMM0_Dc;
            uVar10 = extraout_XMM0_Dd;
            btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
            bVar12 = quatRotate(in_stack_fffffffffffff858._8_8_,in_stack_fffffffffffff858._0_8_);
            local_220 = bVar12.m_floats._8_8_;
            in_stack_fffffffffffff9d8._8_4_ = uVar9;
            in_stack_fffffffffffff9d8._0_8_ = local_220;
            in_stack_fffffffffffff9d8._12_4_ = uVar10;
            in_stack_fffffffffffff9e8._8_4_ = extraout_XMM0_Dc_00;
            in_stack_fffffffffffff9e8._0_8_ = bVar12.m_floats._0_8_;
            in_stack_fffffffffffff9e8._12_4_ = extraout_XMM0_Dd_00;
            local_228 = bVar12.m_floats[0];
            bStack_224 = bVar12.m_floats[1];
            bVar12 = operator-(in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_);
            local_648 = bVar12.m_floats[2];
            bStack_644 = bVar12.m_floats[3];
            local_638 = bVar12.m_floats[0];
            bStack_634 = bVar12.m_floats[1];
            local_218 = local_638;
            bStack_214 = bStack_634;
            local_210 = local_648;
            bStack_20c = bStack_644;
            plVar5 = (long *)(**(code **)(*in_RDI + 0x28))();
            (**(code **)(*plVar5 + 0x20))(plVar5,&local_1d8,&local_218,local_1b8);
          }
          pbVar8 = btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
          if (pbVar8->m_jointType == ePrismatic) {
            bVar11 = btTransform::getRotation((btTransform *)in_stack_fffffffffffff830);
            local_250 = bVar11.super_btQuadWord.m_floats._8_8_;
            local_668 = bVar11.super_btQuadWord.m_floats[0];
            bStack_664 = bVar11.super_btQuadWord.m_floats[1];
            local_258 = local_668;
            bStack_254 = bStack_664;
            btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
            bVar12 = quatRotate(in_stack_fffffffffffff858._8_8_,in_stack_fffffffffffff858._0_8_);
            local_240 = bVar12.m_floats._8_8_;
            local_698 = bVar12.m_floats[0];
            bStack_694 = bVar12.m_floats[1];
            local_248 = local_698;
            bStack_244 = bStack_694;
            local_26c = 0;
            local_270 = 0;
            local_274 = 0;
            local_278 = 0x3f800000;
            btVector4::btVector4
                      (in_stack_fffffffffffff848._8_8_,in_stack_fffffffffffff848._0_8_,
                       in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_,
                       (btScalar *)in_stack_fffffffffffff830);
            btTransform::getOrigin(local_d8);
            bVar12 = operator+(in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_);
            local_290 = bVar12.m_floats._8_8_;
            local_6c8 = bVar12.m_floats[0];
            bStack_6c4 = bVar12.m_floats[1];
            local_298 = local_6c8;
            bStack_294 = bStack_6c4;
            bVar11 = btTransform::getRotation((btTransform *)in_stack_fffffffffffff830);
            local_2b0 = bVar11.super_btQuadWord.m_floats._8_8_;
            local_6e8 = bVar11.super_btQuadWord.m_floats[0];
            bStack_6e4 = bVar11.super_btQuadWord.m_floats[1];
            local_2b8 = local_6e8;
            bStack_2b4 = bStack_6e4;
            btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
            bVar12 = quatRotate(in_stack_fffffffffffff858._8_8_,in_stack_fffffffffffff858._0_8_);
            local_2a0 = bVar12.m_floats._8_8_;
            local_718 = bVar12.m_floats[0];
            bStack_714 = bVar12.m_floats[1];
            local_2a8 = local_718;
            bStack_2a4 = bStack_714;
            bVar12 = operator-(in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_);
            local_280 = bVar12.m_floats._8_8_;
            auVar1._8_4_ = extraout_XMM0_Dc_01;
            auVar1._0_8_ = bVar12.m_floats._0_8_;
            auVar1._12_4_ = extraout_XMM0_Dd_01;
            local_738 = bVar12.m_floats[0];
            bStack_734 = bVar12.m_floats[1];
            local_288 = local_738;
            bStack_284 = bStack_734;
            btTransform::getOrigin(local_d8);
            btTransform::getRotation((btTransform *)in_stack_fffffffffffff830);
            uVar9 = extraout_XMM0_Dc_02;
            uVar10 = extraout_XMM0_Dd_02;
            btMultiBody::getLink(in_stack_fffffffffffff830,in_stack_fffffffffffff82c);
            bVar12 = quatRotate(in_stack_fffffffffffff858._8_8_,in_stack_fffffffffffff858._0_8_);
            in_stack_fffffffffffff858._8_4_ = uVar9;
            in_stack_fffffffffffff858._0_8_ = bVar12.m_floats._8_8_;
            in_stack_fffffffffffff858._12_4_ = uVar10;
            uVar9 = extraout_XMM0_Dc_03;
            uVar10 = extraout_XMM0_Dd_03;
            bVar12 = operator-(in_stack_fffffffffffff838._8_8_,in_stack_fffffffffffff838._0_8_);
            in_stack_fffffffffffff838._8_4_ = uVar9;
            in_stack_fffffffffffff838._0_8_ = bVar12.m_floats._8_8_;
            in_stack_fffffffffffff838._12_4_ = uVar10;
            in_stack_fffffffffffff848._8_4_ = extraout_XMM0_Dc_04;
            in_stack_fffffffffffff848._0_8_ = bVar12.m_floats._0_8_;
            in_stack_fffffffffffff848._12_4_ = extraout_XMM0_Dd_04;
            local_2c0 = bVar12.m_floats[2];
            bStack_2bc = bVar12.m_floats[3];
            local_2c8 = bVar12.m_floats[0];
            bStack_2c4 = bVar12.m_floats[1];
            in_stack_fffffffffffff830 = (btMultiBody *)(**(code **)(*in_RDI + 0x28))();
            (*in_stack_fffffffffffff830->_vptr_btMultiBody[4])
                      (in_stack_fffffffffffff830,&local_288,&local_2c8,local_268);
            _local_738 = auVar1;
          }
        }
        local_7c = local_7c + 1;
      }
      btAlignedObjectArray<btVector3>::~btAlignedObjectArray
                ((btAlignedObjectArray<btVector3> *)0x250fd7);
      btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray
                ((btAlignedObjectArray<btQuaternion> *)0x250fe4);
      CProfileSample::~CProfileSample((CProfileSample *)0x250ff1);
    }
  }
  btDiscreteDynamicsWorld::debugDrawWorld(this_00);
  CProfileSample::~CProfileSample((CProfileSample *)0x25102d);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::debugDrawWorld()
{
	BT_PROFILE("btMultiBodyDynamicsWorld debugDrawWorld");

	bool drawConstraints = false;
	if (getDebugDrawer())
	{
		int mode = getDebugDrawer()->getDebugMode();
		if (mode  & (btIDebugDraw::DBG_DrawConstraints | btIDebugDraw::DBG_DrawConstraintLimits))
		{
			drawConstraints = true;
		}

		if (drawConstraints)
		{
			BT_PROFILE("btMultiBody debugDrawWorld");
			
			btAlignedObjectArray<btQuaternion> world_to_local1;
			btAlignedObjectArray<btVector3> local_origin1;

			for (int c=0;c<m_multiBodyConstraints.size();c++)
			{
				btMultiBodyConstraint* constraint = m_multiBodyConstraints[c];
				debugDrawMultiBodyConstraint(constraint);
			}

			for (int b = 0; b<m_multiBodies.size(); b++)
			{
				btMultiBody* bod = m_multiBodies[b];
				bod->forwardKinematics(world_to_local1,local_origin1);
				
				getDebugDrawer()->drawTransform(bod->getBaseWorldTransform(), 0.1);


				for (int m = 0; m<bod->getNumLinks(); m++)
				{
					
					const btTransform& tr = bod->getLink(m).m_cachedWorldTransform;

					getDebugDrawer()->drawTransform(tr, 0.1);

						//draw the joint axis
					if (bod->getLink(m).m_jointType==btMultibodyLink::eRevolute)
					{
						btVector3 vec = quatRotate(tr.getRotation(),bod->getLink(m).m_axes[0].m_topVec);
					
						btVector4 color(0,0,0,1);//1,1,1);
						btVector3 from = vec+tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						btVector3 to = tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						getDebugDrawer()->drawLine(from,to,color);
					}
					if (bod->getLink(m).m_jointType==btMultibodyLink::eFixed)
					{
						btVector3 vec = quatRotate(tr.getRotation(),bod->getLink(m).m_axes[0].m_bottomVec);
					
						btVector4 color(0,0,0,1);//1,1,1);
						btVector3 from = vec+tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						btVector3 to = tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						getDebugDrawer()->drawLine(from,to,color);
					}
					if (bod->getLink(m).m_jointType==btMultibodyLink::ePrismatic)
					{
						btVector3 vec = quatRotate(tr.getRotation(),bod->getLink(m).m_axes[0].m_bottomVec);
					
						btVector4 color(0,0,0,1);//1,1,1);
						btVector3 from = vec+tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						btVector3 to = tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						getDebugDrawer()->drawLine(from,to,color);
					}
					
				}
			}
		}
	}

	btDiscreteDynamicsWorld::debugDrawWorld();
}